

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matfx.cpp
# Opt level: O3

void * rw::copyMaterialMatFX(void *dst,void *src,int32 offset,int32 param_4)

{
  int *piVar1;
  int iVar2;
  bool bVar3;
  undefined8 *puVar4;
  bool bVar5;
  long lVar6;
  undefined8 *puVar7;
  undefined8 *puVar8;
  byte bVar9;
  
  bVar9 = 0;
  puVar7 = *(undefined8 **)((long)src + (long)offset);
  if (puVar7 != (undefined8 *)0x0) {
    allocLocation =
         "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/matfx.cpp line: 376"
    ;
    puVar4 = (undefined8 *)(*DAT_00149de8)(0x58,0x30120);
    *(undefined8 **)((long)dst + (long)offset) = puVar4;
    puVar8 = puVar4;
    for (lVar6 = 0xb; lVar6 != 0; lVar6 = lVar6 + -1) {
      *puVar8 = *puVar7;
      puVar7 = puVar7 + (ulong)bVar9 * -2 + 1;
      puVar8 = puVar8 + (ulong)bVar9 * -2 + 1;
    }
    lVar6 = 0;
    bVar3 = true;
    do {
      bVar5 = bVar3;
      iVar2 = *(int *)(puVar4 + lVar6 * 5);
      if (iVar2 == 4) {
        lVar6 = puVar4[lVar6 * 5 + 1];
LAB_0012fee8:
        if (lVar6 != 0) {
          *(int *)(lVar6 + 100) = *(int *)(lVar6 + 100) + 1;
        }
      }
      else {
        if (iVar2 == 2) {
          lVar6 = puVar4[lVar6 * 5 + 2];
          goto LAB_0012fee8;
        }
        if (iVar2 == 1) {
          if (puVar4[lVar6 * 5 + 2] != 0) {
            piVar1 = (int *)(puVar4[lVar6 * 5 + 2] + 100);
            *piVar1 = *piVar1 + 1;
          }
          lVar6 = puVar4[lVar6 * 5 + 3];
          goto LAB_0012fee8;
        }
      }
      lVar6 = 1;
      bVar3 = false;
    } while (bVar5);
  }
  return dst;
}

Assistant:

static void*
copyMaterialMatFX(void *dst, void *src, int32 offset, int32)
{
	MatFX *srcfx = *PLUGINOFFSET(MatFX*, src, offset);
	if(srcfx == nil)
		return dst;
	MatFX *dstfx = rwNewT(MatFX, 1, MEMDUR_EVENT | ID_MATFX);
	*PLUGINOFFSET(MatFX*, dst, offset) = dstfx;
	memcpy(dstfx, srcfx, sizeof(MatFX));
	for(int i = 0; i < 2; i++)
		switch(dstfx->fx[i].type){
		case MatFX::BUMPMAP:
			if(dstfx->fx[i].bump.bumpedTex)
				dstfx->fx[i].bump.bumpedTex->addRef();
			if(dstfx->fx[i].bump.tex)
				dstfx->fx[i].bump.tex->addRef();
			break;

		case MatFX::ENVMAP:
			if(dstfx->fx[i].env.tex)
				dstfx->fx[i].env.tex->addRef();
			break;

		case MatFX::DUAL:
			if(dstfx->fx[i].dual.tex)
				dstfx->fx[i].dual.tex->addRef();
			break;
		}
	return dst;
}